

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::StreamingReporterBase::StreamingReporterBase
          (StreamingReporterBase *this,ReporterConfig *_config)

{
  ostream *poVar1;
  ReporterConfig *in_RSI;
  undefined8 *in_RDI;
  ReporterConfig *in_stack_ffffffffffffff98;
  LazyStat<Catch::TestCaseInfo> *in_stack_ffffffffffffffa0;
  
  SharedImpl<Catch::IStreamingReporter>::SharedImpl
            ((SharedImpl<Catch::IStreamingReporter> *)in_stack_ffffffffffffffa0);
  *in_RDI = &PTR__StreamingReporterBase_001f0aa0;
  ReporterConfig::fullConfig(in_stack_ffffffffffffff98);
  poVar1 = ReporterConfig::stream(in_RSI);
  in_RDI[3] = poVar1;
  LazyStat<Catch::TestRunInfo>::LazyStat((LazyStat<Catch::TestRunInfo> *)in_stack_ffffffffffffffa0);
  LazyStat<Catch::GroupInfo>::LazyStat((LazyStat<Catch::GroupInfo> *)in_stack_ffffffffffffffa0);
  LazyStat<Catch::TestCaseInfo>::LazyStat(in_stack_ffffffffffffffa0);
  std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>::vector
            ((vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_> *)0x1cb465);
  ReporterPreferences::ReporterPreferences((ReporterPreferences *)(in_RDI + 0x39));
  *(undefined1 *)(in_RDI + 0x39) = 0;
  return;
}

Assistant:

StreamingReporterBase( ReporterConfig const& _config )
        :   m_config( _config.fullConfig() ),
            stream( _config.stream() )
        {
            m_reporterPrefs.shouldRedirectStdOut = false;
        }